

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O2

void readHeader(char *fileName)

{
  int iVar1;
  Header *pHVar2;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pTVar3;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *pTVar4;
  ostream *poVar5;
  RgbaInputFile file;
  RgbaInputFile local_50 [64];
  
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile(local_50,fileName,iVar1);
  pHVar2 = (Header *)Imf_3_2::RgbaInputFile::header();
  pTVar3 = Imf_3_2::Header::findTypedAttribute<Imf_3_2::TypedAttribute<std::__cxx11::string>>
                     (pHVar2,"comments");
  pHVar2 = (Header *)Imf_3_2::RgbaInputFile::header();
  pTVar4 = Imf_3_2::Header::findTypedAttribute<Imf_3_2::TypedAttribute<Imath_3_2::Matrix44<float>>>
                     (pHVar2,"cameraTransform");
  if (pTVar3 != (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"comments\n   ");
    poVar5 = std::operator<<(poVar5,(string *)(pTVar3 + 8));
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  if (pTVar4 != (TypedAttribute<Imath_3_2::Matrix44<float>_> *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"cameraTransform\n");
    Imath_3_2::operator<<(poVar5,(Matrix44<float> *)(pTVar4 + 8));
    std::ostream::flush();
  }
  Imf_3_2::RgbaInputFile::~RgbaInputFile(local_50);
  return;
}

Assistant:

void
readHeader (const char fileName[])
{
    //
    // Read an image's header from a file, and if the header
    // contains comments and camera transformation attributes,
    // print the values of those attributes.
    //
    //	- open the file
    //	- get the file header
    //	- look for the attributes
    //

    RgbaInputFile file (fileName);

    const StringAttribute* comments =
        file.header ().findTypedAttribute<StringAttribute> ("comments");

    const M44fAttribute* cameraTransform =
        file.header ().findTypedAttribute<M44fAttribute> ("cameraTransform");

    if (comments) cout << "comments\n   " << comments->value () << endl;

    if (cameraTransform)
        cout << "cameraTransform\n" << cameraTransform->value () << flush;
}